

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_SpawnBlood(DVector3 *pos1,DAngle *dir,int damage,AActor *originator)

{
  byte *pbVar1;
  double dVar2;
  FState *pFVar3;
  int iVar4;
  PalEntry kind;
  int iVar5;
  uint uVar6;
  PClassActor *type;
  AActor *this;
  FState *newstate;
  PClass *pPVar7;
  SDWORD SVar8;
  FState *pFVar9;
  uint uVar10;
  ulong uVar12;
  FName local_5c;
  DVector3 local_58;
  DAngle local_38;
  ulong uVar11;
  
  kind = AActor::GetBloodColor(originator);
  type = AActor::GetBloodType(originator,0);
  local_58.X = pos1->X;
  local_58.Y = pos1->Y;
  dVar2 = pos1->Z;
  iVar5 = FRandom::Random2(&pr_spawnblood);
  iVar4 = cl_bloodtype.Value;
  local_58.Z = (double)iVar5 * 0.015625 + dVar2;
  uVar6 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    iVar5 = *(int *)((type->super_PClass).Defaults + 0x198);
    this = Spawn(type,&local_58,NO_REPLACE);
    (this->Vel).Z = 2.0;
    (this->Angles).Yaw.Degrees = dir->Degrees;
    if (((this->flags5).Value & 0x800000) != 0) {
      (this->target).field_0.p = originator;
    }
    if ((gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
      uVar6 = FRandom::operator()(&pr_spawnblood);
      SVar8 = this->tics - (uVar6 & 3);
      if (SVar8 < 2) {
        SVar8 = 1;
      }
      this->tics = SVar8;
    }
    if ((kind.field_0 != 0) && (((this->flags2).Value & 0x10000) == 0)) {
      this->Translation = (uint)kind.field_0 >> 0x18 | 0x80000;
    }
    uVar6 = (iVar5 << 4) >> 0x1f & iVar4;
    if ((gameinfo.gametype & GAME_DoomStrifeChex) != GAME_Any) {
      if (gameinfo.gametype == GAME_Strife) {
        if (damage < 0xe) {
          damage = damage + 2;
        }
        else {
          local_5c.Index = 0x10;
          newstate = AActor::FindState(this,&local_5c);
          if (newstate != (FState *)0x0) {
LAB_004c2596:
            AActor::SetState(this,newstate,false);
            goto LAB_004c259d;
          }
        }
      }
      uVar12 = (ulong)((uint)(damage < 9) * 2);
      if (damage - 9U < 4) {
        uVar12 = 1;
      }
      for (pPVar7 = DObject::GetClass((DObject *)this); pPVar7 != AActor::RegistrationInfo.MyClass;
          pPVar7 = pPVar7->ParentClass) {
        if (damage < 0xd) {
          pFVar9 = (FState *)
                   pPVar7[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                   super_DObject._vptr_DObject;
          pFVar3 = this->SpawnState;
          if ((pFVar9 <= pFVar3) &&
             (pFVar9 = pFVar9 + *(int *)&pPVar7[1].super_PStruct.super_PNamedType.
                                         super_PCompoundType.super_PType.super_DObject.GCNext,
             uVar11 = uVar12, pFVar3 < pFVar9)) {
            do {
              uVar10 = (uint)uVar11;
              newstate = pFVar3 + uVar11;
              if (newstate < pFVar9) goto LAB_004c2596;
              uVar11 = 1;
            } while (1 < uVar10);
          }
        }
      }
    }
LAB_004c259d:
    if (1 < (int)uVar6) {
      pbVar1 = (byte *)((long)&(this->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_004c25b1;
    }
  }
  if ((int)uVar6 < 1) {
    return;
  }
LAB_004c25b1:
  local_38 = (DAngle)dir->Degrees;
  P_DrawSplash2(0x28,&local_58,&local_38,2,(int)kind.field_0);
  return;
}

Assistant:

void P_SpawnBlood (const DVector3 &pos1, DAngle dir, int damage, AActor *originator)
{
	AActor *th;
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType();
	DVector3 pos = pos1;
	pos.Z += pr_spawnblood.Random2() / 64.;

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		th = Spawn(bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		th->Vel.Z = 2;
		th->Angles.Yaw = dir;
		// [NG] Applying PUFFGETSOWNER to the blood will make it target the owner
		if (th->flags5 & MF5_PUFFGETSOWNER) th->target = originator;
		if (gameinfo.gametype & GAME_DoomChex)
		{
			th->tics -= pr_spawnblood() & 3;

			if (th->tics < 1)
				th->tics = 1;
		}
		// colorize the blood
		if (bloodcolor != 0 && !(th->flags2 & MF2_DONTTRANSLATE))
		{
			th->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}
		
		// Moved out of the blood actor so that replacing blood is easier
		if (gameinfo.gametype & GAME_DoomStrifeChex)
		{
			if (gameinfo.gametype == GAME_Strife)
			{
				if (damage > 13)
				{
					FState *state = th->FindState(NAME_Spray);
					if (state != NULL)
					{
						th->SetState (state);
						goto statedone;
					}
				}
				else damage += 2;
			}
			int advance = 0;
			if (damage <= 12 && damage >= 9)
			{
				advance = 1;
			}
			else if (damage < 9)
			{
				advance = 2;
			}

			PClassActor *cls = th->GetClass();

			while (cls != RUNTIME_CLASS(AActor))
			{
				int checked_advance = advance;
				if (cls->OwnsState(th->SpawnState))
				{
					for (; checked_advance > 0; --checked_advance)
					{
						// [RH] Do not set to a state we do not own.
						if (cls->OwnsState(th->SpawnState + checked_advance))
						{
							th->SetState(th->SpawnState + checked_advance);
							goto statedone;
						}
					}
				}
				// We can safely assume the ParentClass is of type PClassActor
				// since we stop when we see the Actor base class.
				cls = static_cast<PClassActor *>(cls->ParentClass);
			}
		}

	statedone:
		if (!(bloodtype <= 1)) th->renderflags |= RF_INVISIBLE;
	}

	if (bloodtype >= 1)
		P_DrawSplash2 (40, pos, dir, 2, bloodcolor);
}